

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O0

void __thiscall
spvtools::opt::analysis::ConstantManager::RemoveId(ConstantManager *this,uint32_t id)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
  local_28;
  _Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
  local_20;
  iterator it;
  uint32_t id_local;
  ConstantManager *this_local;
  
  it.
  super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
  ._M_cur._4_4_ = id;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_const_spvtools::opt::analysis::Constant_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>_>_>
       ::find(&this->id_to_const_val_,
              (key_type *)
              ((long)&it.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
                      ._M_cur + 4));
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_const_spvtools::opt::analysis::Constant_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>_>_>
       ::end(&this->id_to_const_val_);
  bVar1 = std::__detail::operator!=(&local_20,&local_28);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false,_false>
                           *)&local_20);
    std::
    multimap<const_spvtools::opt::analysis::Constant_*,_unsigned_int,_std::less<const_spvtools::opt::analysis::Constant_*>,_std::allocator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>_>
    ::erase(&this->const_val_to_id_,&ppVar2->second);
    std::
    unordered_map<unsigned_int,_const_spvtools::opt::analysis::Constant_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>_>_>
    ::erase(&this->id_to_const_val_,(iterator)local_20._M_cur);
  }
  return;
}

Assistant:

void RemoveId(uint32_t id) {
    auto it = id_to_const_val_.find(id);
    if (it != id_to_const_val_.end()) {
      const_val_to_id_.erase(it->second);
      id_to_const_val_.erase(it);
    }
  }